

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

Channel * __thiscall
DBOPL::Channel::BlockTemplate<(DBOPL::SynthMode)6>
          (Channel *this,Chip *chip,Bit32u samples,Bit32s *output)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Operator *pOVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  code *local_2e8;
  code *local_2c0;
  code *local_298;
  code *local_270;
  Bits next;
  Bit32s out0;
  Bit32s sample;
  Bit32s mod;
  Bitu i;
  Bit32s *output_local;
  Bit32u samples_local;
  Chip *chip_local;
  Channel *this_local;
  Bit32s neg_3;
  Bit32s add_3;
  Bit32s neg_2;
  Bit32s add_2;
  Bit32s neg_1;
  Bit32s add_1;
  Bit32s neg;
  Bit32s add;
  Bitu index_3;
  Bitu vol_3;
  Bitu index_2;
  Bitu vol_2;
  long local_100;
  Bitu index_1;
  Bitu vol_1;
  long local_d8;
  Bitu index;
  Bitu vol;
  
  pOVar6 = Op(this,0);
  if (pOVar6->totalLevel + pOVar6->volume < 0x180) {
    bVar3 = false;
  }
  else if (((uint)pOVar6->rateZero & 1 << (pOVar6->state & 0x1f)) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  if (bVar3) {
    pOVar6 = Op(this,3);
    if (pOVar6->totalLevel + pOVar6->volume < 0x180) {
      bVar3 = false;
    }
    else if (((uint)pOVar6->rateZero & 1 << (pOVar6->state & 0x1f)) == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    if (bVar3) {
      this->old[1] = 0;
      this->old[0] = 0;
      goto LAB_0018c2cb;
    }
  }
  pOVar6 = Op(this,0);
  pOVar6->currentLevel = pOVar6->totalLevel + (uint)(chip->tremoloValue & pOVar6->tremoloMask);
  pOVar6->waveCurrent = pOVar6->waveAdd;
  if ((int)(uint)pOVar6->vibStrength >> (chip->vibratoShift & 0x1f) != 0) {
    pOVar6->waveCurrent =
         ((pOVar6->vibrato >> (chip->vibratoShift & 0x1f) ^ (int)chip->vibratoSign) -
         (int)chip->vibratoSign) + pOVar6->waveCurrent;
  }
  pOVar6 = Op(this,1);
  pOVar6->currentLevel = pOVar6->totalLevel + (uint)(chip->tremoloValue & pOVar6->tremoloMask);
  pOVar6->waveCurrent = pOVar6->waveAdd;
  if ((int)(uint)pOVar6->vibStrength >> (chip->vibratoShift & 0x1f) != 0) {
    pOVar6->waveCurrent =
         ((pOVar6->vibrato >> (chip->vibratoShift & 0x1f) ^ (int)chip->vibratoSign) -
         (int)chip->vibratoSign) + pOVar6->waveCurrent;
  }
  pOVar6 = Op(this,2);
  pOVar6->currentLevel = pOVar6->totalLevel + (uint)(chip->tremoloValue & pOVar6->tremoloMask);
  pOVar6->waveCurrent = pOVar6->waveAdd;
  if ((int)(uint)pOVar6->vibStrength >> (chip->vibratoShift & 0x1f) != 0) {
    pOVar6->waveCurrent =
         ((pOVar6->vibrato >> (chip->vibratoShift & 0x1f) ^ (int)chip->vibratoSign) -
         (int)chip->vibratoSign) + pOVar6->waveCurrent;
  }
  pOVar6 = Op(this,3);
  pOVar6->currentLevel = pOVar6->totalLevel + (uint)(chip->tremoloValue & pOVar6->tremoloMask);
  pOVar6->waveCurrent = pOVar6->waveAdd;
  if ((int)(uint)pOVar6->vibStrength >> (chip->vibratoShift & 0x1f) != 0) {
    pOVar6->waveCurrent =
         ((pOVar6->vibrato >> (chip->vibratoShift & 0x1f) ^ (int)chip->vibratoSign) -
         (int)chip->vibratoSign) + pOVar6->waveCurrent;
  }
  for (_sample = 0; _sample < samples; _sample = _sample + 1) {
    iVar4 = this->old[0];
    iVar5 = this->old[1];
    bVar1 = this->feedback;
    this->old[0] = this->old[1];
    pOVar6 = Op(this,0);
    uVar2 = pOVar6->currentLevel;
    local_270 = (code *)pOVar6->volHandler;
    plVar9 = (long *)((long)&pOVar6->volHandler + *(long *)&pOVar6->field_0x8);
    if (((ulong)local_270 & 1) != 0) {
      local_270 = *(code **)(local_270 + *plVar9 + -1);
    }
    lVar7 = (*local_270)(plVar9);
    uVar8 = (ulong)uVar2 + lVar7;
    if (uVar8 < 0x180) {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      iVar4 = (int)((int)pOVar6->waveBase
                         [(long)(int)((uint)(iVar4 + iVar5) >> (bVar1 & 0x1f)) +
                          (ulong)(pOVar6->waveIndex >> 0x16) & (ulong)pOVar6->waveMask] *
                   (uint)*(ushort *)(MulTable + uVar8 * 2)) >> 0x10;
    }
    else {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      iVar4 = 0;
    }
    this->old[1] = iVar4;
    iVar4 = this->old[0];
    pOVar6 = Op(this,1);
    uVar2 = pOVar6->currentLevel;
    local_298 = (code *)pOVar6->volHandler;
    plVar9 = (long *)((long)&pOVar6->volHandler + *(long *)&pOVar6->field_0x8);
    if (((ulong)local_298 & 1) != 0) {
      local_298 = *(code **)(local_298 + *plVar9 + -1);
    }
    lVar7 = (*local_298)(plVar9);
    uVar8 = (ulong)uVar2 + lVar7;
    if (uVar8 < 0x180) {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      local_d8 = (long)((int)((int)pOVar6->waveBase[pOVar6->waveIndex >> 0x16 & pOVar6->waveMask] *
                             (uint)*(ushort *)(MulTable + uVar8 * 2)) >> 0x10);
    }
    else {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      local_d8 = 0;
    }
    pOVar6 = Op(this,2);
    uVar2 = pOVar6->currentLevel;
    local_2c0 = (code *)pOVar6->volHandler;
    plVar9 = (long *)((long)&pOVar6->volHandler + *(long *)&pOVar6->field_0x8);
    if (((ulong)local_2c0 & 1) != 0) {
      local_2c0 = *(code **)(local_2c0 + *plVar9 + -1);
    }
    lVar7 = (*local_2c0)(plVar9);
    uVar8 = (ulong)uVar2 + lVar7;
    if (uVar8 < 0x180) {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      local_100 = (long)((int)((int)pOVar6->waveBase
                                    [local_d8 + (ulong)(pOVar6->waveIndex >> 0x16) &
                                     (ulong)pOVar6->waveMask] *
                              (uint)*(ushort *)(MulTable + uVar8 * 2)) >> 0x10);
    }
    else {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      local_100 = 0;
    }
    pOVar6 = Op(this,3);
    uVar2 = pOVar6->currentLevel;
    local_2e8 = (code *)pOVar6->volHandler;
    plVar9 = (long *)((long)&pOVar6->volHandler + *(long *)&pOVar6->field_0x8);
    if (((ulong)local_2e8 & 1) != 0) {
      local_2e8 = *(code **)(local_2e8 + *plVar9 + -1);
    }
    lVar7 = (*local_2e8)(plVar9);
    uVar8 = (ulong)uVar2 + lVar7;
    if (uVar8 < 0x180) {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      iVar5 = (int)((int)pOVar6->waveBase
                         [local_100 + (ulong)(pOVar6->waveIndex >> 0x16) & (ulong)pOVar6->waveMask]
                   * (uint)*(ushort *)(MulTable + uVar8 * 2)) >> 0x10;
    }
    else {
      pOVar6->waveIndex = pOVar6->waveCurrent + pOVar6->waveIndex;
      iVar5 = 0;
    }
    iVar5 = iVar5 + iVar4;
    output[_sample * 2] =
         ((int)(iVar5 * (uint)this->panLeft) / 0xffff & (int)this->maskLeft) + output[_sample * 2];
    output[_sample * 2 + 1] =
         ((int)(iVar5 * (uint)this->panRight) / 0xffff & (int)this->maskRight) +
         output[_sample * 2 + 1];
  }
LAB_0018c2cb:
  this_local = this + 2;
  return this_local;
}

Assistant:

Channel* Channel::BlockTemplate( Chip* chip, Bit32u samples, Bit32s* output ) {
	switch( mode ) {
	case sm2AM:
	case sm3AM:
		if ( Op(0)->Silent() && Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm2FM:
	case sm3FM:
		if ( Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm3FMFM:
		if ( Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMFM:
		if ( Op(0)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3FMAM:
		if ( Op(1)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMAM:
		if ( Op(0)->Silent() && Op(2)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	default:
		break;
	}
	//Init the operators with the the current vibrato and tremolo values
	Op( 0 )->Prepare( chip );
	Op( 1 )->Prepare( chip );
	if ( mode > sm4Start ) {
		Op( 2 )->Prepare( chip );
		Op( 3 )->Prepare( chip );
	}
	if ( mode > sm6Start ) {
		Op( 4 )->Prepare( chip );
		Op( 5 )->Prepare( chip );
	}
	for ( Bitu i = 0; i < samples; i++ ) {
		//Early out for percussion handlers
		if ( mode == sm2Percussion ) {
			GeneratePercussion<false>( chip, output + i );
			continue;	//Prevent some unitialized value bitching
		} else if ( mode == sm3Percussion ) {
			GeneratePercussion<true>( chip, output + i * 2 );
			continue;	//Prevent some unitialized value bitching
		}

		//Do unsigned shift so we can shift out all bits but still stay in 10 bit range otherwise
		Bit32s mod = (Bit32u)((old[0] + old[1])) >> feedback;
		old[0] = old[1];
		old[1] = static_cast<Bit32u>(Op(0)->GetSample( mod ));
		Bit32s sample;
		Bit32s out0 = old[0];
		if ( mode == sm2AM || mode == sm3AM ) {
			sample = static_cast<Bit32u>(out0 + Op(1)->GetSample( 0 ));
		} else if ( mode == sm2FM || mode == sm3FM ) {
			sample = static_cast<Bit32u>(Op(1)->GetSample( out0 ));
		} else if ( mode == sm3FMFM ) {
			Bits next = Op(1)->GetSample( out0 );
			next = Op(2)->GetSample( next );
			sample = static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3AMFM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			next = Op(2)->GetSample( next );
			sample += static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3FMAM ) {
			sample = static_cast<Bit32u>(Op(1)->GetSample( out0 ));
			Bits next = Op(2)->GetSample( 0 );
			sample += static_cast<Bit32u>(Op(3)->GetSample( next ));
		} else if ( mode == sm3AMAM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			sample += static_cast<Bit32u>(Op(2)->GetSample( next ));
			sample += static_cast<Bit32u>(Op(3)->GetSample( 0 ));
		}
		switch( mode ) {
		case sm2AM:
		case sm2FM:
			output[ i ] += sample;
			break;
		case sm3AM:
		case sm3FM:
		case sm3FMFM:
		case sm3AMFM:
		case sm3FMAM:
		case sm3AMAM:
			output[ i * 2 + 0 ] += (sample * panLeft / 65535) & maskLeft;
			output[ i * 2 + 1 ] += (sample * panRight / 65535) & maskRight;
			break;
		default:
			break;
		}
	}
	switch( mode ) {
	case sm2AM:
	case sm2FM:
	case sm3AM:
	case sm3FM:
		return ( this + 1 );
	case sm3FMFM:
	case sm3AMFM:
	case sm3FMAM:
	case sm3AMAM:
		return( this + 2 );
	case sm2Percussion:
	case sm3Percussion:
		return( this + 3 );
	}
	return 0;
}